

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  aiNodeAnim *pNodeAnim;
  ulong uVar1;
  
  Validate(this,&pAnimation->mName);
  if (pAnimation->mNumChannels == 0) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if (pAnimation->mChannels != (aiNodeAnim **)0x0) {
    if (pAnimation->mNumChannels != 0) {
      pNodeAnim = *pAnimation->mChannels;
      uVar1 = 0;
      while( true ) {
        if (pNodeAnim == (aiNodeAnim *)0x0) {
          ReportError(this,"aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                      uVar1 & 0xffffffff);
        }
        Validate(this,pAnimation,pNodeAnim);
        if (pAnimation->mNumChannels <= (int)uVar1 + 1U) break;
        pNodeAnim = pAnimation->mChannels[uVar1 + 1];
        uVar1 = uVar1 + 1;
      }
    }
    return;
  }
  ReportError(this,"aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)");
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all materials
    if (pAnimation->mNumChannels)
    {
        if (!pAnimation->mChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}